

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_array_getFirstElements(sysbvm_context_t *context,sysbvm_tuple_t array,size_t size)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  
  if ((array & 0xf) == 0 && array != 0) {
    uVar1 = (ulong)(*(uint *)(array + 0xc) >> 3);
    if (uVar1 < size) {
      size = uVar1;
    }
    sVar2 = sysbvm_array_create(context,size);
    if (size != 0) {
      sVar3 = 0;
      do {
        *(undefined8 *)(sVar2 + 0x10 + sVar3 * 8) = *(undefined8 *)(array + 0x10 + sVar3 * 8);
        sVar3 = sVar3 + 1;
      } while (size != sVar3);
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_array_getFirstElements(sysbvm_context_t *context, sysbvm_tuple_t array, size_t size)
{
    if(!sysbvm_tuple_isNonNullPointer(array)) return SYSBVM_NULL_TUPLE;

    size_t resultSize = sysbvm_tuple_getSizeInSlots(array);
    if(size < resultSize)
        resultSize = size;

    sysbvm_array_t *source = (sysbvm_array_t*)array;
    sysbvm_array_t *result = (sysbvm_array_t*)sysbvm_array_create(context, resultSize);
    for(size_t i = 0; i < resultSize; ++i)
        result->elements[i] = source->elements[i];

    return (sysbvm_tuple_t)result;
}